

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_half_to_float_3chan_interleave(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int x;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  void *pvVar13;
  float fVar14;
  
  pvVar6 = decode->unpacked_buffer;
  peVar3 = decode->channels;
  uVar1 = peVar3->width;
  iVar5 = (decode->chunk).height;
  iVar2 = peVar3->user_line_stride;
  pfVar11 = (float *)(peVar3->field_12).decode_to_ptr;
  lVar4 = (long)(int)(uVar1 * 6);
  iVar8 = 0;
  uVar12 = 0;
  if (0 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  pvVar7 = (void *)((long)pvVar6 + (long)(int)uVar1 * 4);
  pvVar13 = (void *)((long)pvVar6 + (long)(int)uVar1 * 2);
  for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
    pfVar10 = pfVar11;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      fVar14 = half_to_float(*(uint16_t *)((long)pvVar6 + uVar9 * 2));
      *pfVar10 = fVar14;
      fVar14 = half_to_float(*(uint16_t *)((long)pvVar13 + uVar9 * 2));
      pfVar10[1] = fVar14;
      fVar14 = half_to_float(*(uint16_t *)((long)pvVar7 + uVar9 * 2));
      pfVar10[2] = fVar14;
      pfVar10 = pfVar10 + 3;
    }
    pvVar6 = (void *)((long)pvVar6 + lVar4);
    pfVar11 = (float *)((long)pfVar11 + (long)iVar2);
    pvVar7 = (void *)((long)pvVar7 + lVar4);
    pvVar13 = (void *)((long)pvVar13 + lVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_half_to_float_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        float* out = (float*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = half_to_float (one_to_native16 (in0[x]));
            out[1] = half_to_float (one_to_native16 (in1[x]));
            out[2] = half_to_float (one_to_native16 (in2[x]));
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}